

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
sort_fn<std::less<void>>::operator()
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          sort_fn<std::less<void>> *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *c)

{
  iterator iVar1;
  iterator iVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *c_local;
  sort_fn<std::less<void>_> *this_local;
  
  iVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(c);
  iVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(c);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,std::less<void>>
            (iVar1._M_current,iVar2._M_current);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c) const
    {
        std::sort(c.begin(), c.end(), compare);
        return c;
    }